

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<long,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<long,_long> *source_00;
  ArgMinMaxState<long,_long> *in_RCX;
  idx_t i;
  ArgMinMaxState<long,_long> **tdata;
  ArgMinMaxState<long,_long> **sdata;
  ArgMinMaxState<long,_long> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<long,long>const*>((Vector *)0x90f462);
  source_00 = (ArgMinMaxState<long,_long> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<long,long>*>((Vector *)0x90f471);
  for (target_00 = (ArgMinMaxState<long,_long> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<long,_long> *)&(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::LessThan,false>::
    Combine<duckdb::ArgMinMaxState<long,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
              (source_00,target_00,(AggregateInputData *)0x90f4ad);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}